

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [13];
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  LazyStat<Catch::GroupInfo>::reset(&(this->super_StreamingReporterBase).currentGroupInfo);
  std::__cxx11::string::string(local_b0,"OverallResults",(allocator *)(local_30 + 0xc));
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml);
  std::__cxx11::string::string((string *)&local_90,"successes",&local_23);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_90,(unsigned_long *)&testGroupStats->totals);
  std::__cxx11::string::string((string *)&local_70,"failures",&local_22);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_70,&(testGroupStats->totals).assertions.failed);
  std::__cxx11::string::string((string *)&local_50,"expectedFailures",&local_21);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_50,&(testGroupStats->totals).assertions.failedButOk)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  std::__cxx11::string::~string(local_b0);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) CATCH_OVERRIDE {
            StreamingReporterBase::testGroupEnded( testGroupStats );
            // TODO: Check testGroupStats.aborting and act accordingly.
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
                .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
                .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
            m_xml.endElement();
        }